

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90 [32];
  undefined1 local_70 [27];
  bool looked_in_acroform;
  allocator<char> local_49;
  string local_48 [32];
  QPDFObjectHandle value;
  QPDFFormFieldObjectHelper *this_local;
  string *result;
  
  value.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/DA",&local_49);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffd8,(string *)this);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_70[0x13] = 0;
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_90,"/DA",&local_91);
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)local_70,(string *)this);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)&stack0xffffffffffffffd8,(QPDFObjectHandle *)local_70);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    local_70[0x13] = 1;
  }
  local_92 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper DA present",(byte)~local_70[0x13] & 1);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              (&local_b8,(QPDFObjectHandle *)&stack0xffffffffffffffd8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  local_92 = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getDefaultAppearance()
{
    auto value = getInheritableFieldValue("/DA");
    bool looked_in_acroform = false;
    if (!value.isString()) {
        value = getFieldFromAcroForm("/DA");
        looked_in_acroform = true;
    }
    std::string result;
    if (value.isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper DA present", looked_in_acroform ? 0 : 1);
        result = value.getUTF8Value();
    }
    return result;
}